

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::RunContext::invokeTestCase(TestCase *testCase)

{
  FatalConditionHandler fatalConditionHandler;
  FatalConditionHandler local_9;
  
  FatalConditionHandler::FatalConditionHandler(&local_9);
  (*(((testCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  FatalConditionHandler::reset(&local_9);
  FatalConditionHandler::reset(&local_9);
  return;
}

Assistant:

static void invokeTestCase( TestCase const& testCase ) {
            FatalConditionHandler fatalConditionHandler; // Handle signals
            testCase.invoke();
            fatalConditionHandler.reset(); // Not strictly needed but avoids warnings
        }